

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_OnObjectIgnored_MatchingAlreadyWhenObjectPassed_Test::testBody
          (TEST_MockCallTest_OnObjectIgnored_MatchingAlreadyWhenObjectPassed_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  SimpleString SStack_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&SStack_28);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x170))
            ((long *)CONCAT44(extraout_var,iVar1),1);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  return;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_MatchingAlreadyWhenObjectPassed)
{
    void* objectPtr = (void*) 0x001;
    mock().expectOneCall("boo");
    mock().actualCall("boo").onObject(objectPtr);
}